

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O2

CAmount __thiscall CTransaction::GetValueOut(CTransaction *this)

{
  ulong uVar1;
  runtime_error *this_00;
  pointer pCVar2;
  long in_FS_OFFSET;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = (this->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = 0;
  do {
    if (pCVar2 == (this->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        return uVar1;
      }
      goto LAB_00154528;
    }
    if (2100000000000000 < (ulong)pCVar2->nValue) break;
    uVar1 = uVar1 + pCVar2->nValue;
    pCVar2 = pCVar2 + 1;
  } while (uVar1 < 0x775f05a074001);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"GetValueOut",&local_61);
  std::operator+(&local_40,&local_60,": value out of range");
  std::runtime_error::runtime_error(this_00,(string *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_00154528:
  __stack_chk_fail();
}

Assistant:

CAmount CTransaction::GetValueOut() const
{
    CAmount nValueOut = 0;
    for (const auto& tx_out : vout) {
        if (!MoneyRange(tx_out.nValue) || !MoneyRange(nValueOut + tx_out.nValue))
            throw std::runtime_error(std::string(__func__) + ": value out of range");
        nValueOut += tx_out.nValue;
    }
    assert(MoneyRange(nValueOut));
    return nValueOut;
}